

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveInstantiation.cpp
# Opt level: O0

bool __thiscall
Inferences::PrimitiveInstantiation::IsInstantiable::operator()(IsInstantiable *this,Literal *l)

{
  bool bVar1;
  TermList *pTVar2;
  Term *in_RSI;
  TermStack args;
  TermList head;
  TermList rhs;
  TermList lhs;
  TermStack *args_00;
  TermList in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  TermList local_60 [4];
  TermStack local_40;
  TermList local_20;
  Term *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  local_20 = Kernel::SortHelper::getEqualityArgumentSort
                       ((Literal *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_40._end = (TermList *)Kernel::AtomicSort::boolSort();
  bVar1 = Kernel::TermList::operator!=(&local_20,(TermList *)&local_40._end);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    pTVar2 = Kernel::Term::nthArgument(local_18,0);
    local_40._cursor = (TermList *)pTVar2->_content;
    pTVar2 = Kernel::Term::nthArgument(local_18,1);
    local_40._stack = (TermList *)pTVar2->_content;
    args_00 = &local_40;
    Kernel::TermList::TermList((TermList *)args_00);
    pTVar2 = local_60;
    Lib::Stack<Kernel::TermList>::Stack
              ((Stack<Kernel::TermList> *)in_stack_ffffffffffffff80._content,(size_t)pTVar2);
    ApplicativeHelper::getHeadAndArgs(in_stack_ffffffffffffff80,pTVar2,args_00);
    bVar1 = Kernel::TermList::isVar((TermList *)args_00);
    if (bVar1) {
      local_1 = 1;
    }
    else {
      ApplicativeHelper::getHeadAndArgs((TermList)local_40._stack,pTVar2,args_00);
      bVar1 = Kernel::TermList::isVar((TermList *)args_00);
      if (bVar1) {
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
    Lib::Stack<Kernel::TermList>::~Stack(args_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool operator()(Literal* l)
  { 
    if(SortHelper::getEqualityArgumentSort(l) != AtomicSort::boolSort()){
      return false;
    }
    
    TermList lhs = *(l->nthArgument(0));
    TermList rhs = *(l->nthArgument(1));
    
    TermList head;
    TermStack args;
    ApplicativeHelper::getHeadAndArgs(lhs, head, args);
    if(head.isVar()){ return true; }
    ApplicativeHelper::getHeadAndArgs(rhs, head, args);
    if(head.isVar()){ return true; }

    return false; 
  }